

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O3

bool __thiscall IRBuilderAsmJs::IsLoopBodyOuterOffset(IRBuilderAsmJs *this,uint offset)

{
  bool bVar1;
  JITLoopHeaderIDL *pJVar2;
  
  bVar1 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
  if (bVar1) {
    pJVar2 = JITTimeWorkItem::GetLoopHeader(this->m_func->m_workItem);
    bVar1 = true;
    if (offset < pJVar2->endOffset) {
      pJVar2 = JITTimeWorkItem::GetLoopHeader(this->m_func->m_workItem);
      bVar1 = offset < pJVar2->startOffset;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool
IRBuilderAsmJs::IsLoopBodyOuterOffset(uint offset) const
{
    if (!IsLoopBody())
    {
        return false;
    }

    return (offset >= m_func->GetWorkItem()->GetLoopHeader()->endOffset || offset < m_func->GetWorkItem()->GetLoopHeader()->startOffset);
}